

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

size_t luaO_str2num(char *s,TValue *o)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  char *pcVar8;
  size_t sVar9;
  lconv *plVar10;
  Value VVar11;
  LuaType LVar12;
  uint mode;
  int iVar13;
  Value VVar14;
  char cVar15;
  ulong uVar16;
  int iVar17;
  TValue *io;
  lua_Number n;
  Value local_100;
  char local_f8 [208];
  
  pbVar6 = (byte *)s;
  do {
    pbVar5 = pbVar6;
    bVar1 = *pbVar5;
    pbVar6 = pbVar5 + 1;
  } while ((""[(ulong)bVar1 + 1] & 8) != 0);
  pbVar7 = pbVar6;
  if ((bVar1 == 0x2b) || (pbVar7 = pbVar5, bVar1 != 0x2d)) {
    iVar13 = 7;
    bVar4 = true;
  }
  else {
    iVar13 = 8;
    bVar4 = false;
    pbVar7 = pbVar6;
  }
  uVar16 = (ulong)*pbVar7;
  if ((uVar16 == 0x30) && ((pbVar7[1] | 0x20) == 0x78)) {
    uVar16 = (ulong)pbVar7[2];
    pbVar7 = pbVar7 + 2;
    if ((""[uVar16 + 1] & 0x10) == 0) {
LAB_00119f2d:
      bVar3 = false;
      VVar14.gc = (GCObject *)0x0;
    }
    else {
      VVar14.gc = (GCObject *)0x0;
      do {
        cVar15 = (char)uVar16;
        iVar13 = ((int)cVar15 | 0x20U) - 0x57;
        if ((""[(long)cVar15 + 1] & 2) != 0) {
          iVar13 = (int)cVar15 - 0x30;
        }
        VVar14.gc = (GCObject *)((long)iVar13 + VVar14.i * 0x10);
        uVar16 = (ulong)pbVar7[1];
        pbVar7 = pbVar7 + 1;
      } while ((""[uVar16 + 1] & 0x10) != 0);
      bVar3 = true;
    }
  }
  else {
    if ((""[uVar16 + 1] & 2) == 0) goto LAB_00119f2d;
    bVar3 = true;
    VVar14.gc = (GCObject *)0x0;
    do {
      iVar17 = (char)uVar16 + -0x30;
      if ((VVar14.gc < (GCObject *)0xccccccccccccccc) ||
         (iVar17 <= iVar13 && VVar14.gc == (GCObject *)0xccccccccccccccc)) {
        VVar14.gc = (GCObject *)((long)iVar17 + VVar14.i * 10);
        bVar2 = true;
        bVar3 = false;
      }
      else {
        bVar2 = false;
      }
      if (!bVar2) {
        pbVar7 = (byte *)0x0;
        VVar11 = (Value)"";
        goto LAB_00119fd1;
      }
      uVar16 = (ulong)pbVar7[1];
      pbVar7 = pbVar7 + 1;
    } while ((""[uVar16 + 1] & 2) != 0);
    bVar3 = !bVar3;
  }
  pbVar7 = pbVar7 + -1;
  do {
    bVar1 = pbVar7[1];
    pbVar7 = pbVar7 + 1;
  } while ((""[(ulong)bVar1 + 1] & 8) != 0);
  VVar11.i._1_7_ = 0x15c1;
  VVar11._0_1_ = bVar1 != 0;
  if (!bVar3 || bVar1 != 0) {
    pbVar7 = (byte *)0x0;
  }
  else {
    VVar11.i = -VVar14.i;
    if (bVar4) {
      VVar11 = VVar14;
    }
  }
LAB_00119fd1:
  LVar12 = 0x13;
  if (pbVar7 != (byte *)0x0) goto LAB_0011a099;
  pbVar6 = (byte *)strpbrk(s,".xXnN");
  if (pbVar6 == (byte *)0x0) {
    mode = 0;
  }
  else {
    mode = *pbVar6 | 0x20;
  }
  if (mode == 0x6e) {
LAB_0011a001:
    pbVar7 = (byte *)0x0;
  }
  else {
    pbVar7 = (byte *)l_str2dloc(s,&local_100.n,mode);
    if (pbVar7 == (byte *)0x0) {
      pcVar8 = strchr(s,0x2e);
      sVar9 = strlen(s);
      if (pcVar8 == (char *)0x0 || 200 < sVar9) goto LAB_0011a001;
      strcpy(local_f8,s);
      plVar10 = localeconv();
      pcVar8[(long)(local_f8 + -(long)s)] = *plVar10->decimal_point;
      pcVar8 = l_str2dloc(local_f8,&local_100.n,mode);
      pbVar7 = (byte *)(s + ((long)pcVar8 - (long)local_f8));
      if (pcVar8 == (char *)0x0) {
        pbVar7 = (byte *)0x0;
      }
    }
  }
  if (pbVar7 == (byte *)0x0) {
    return 0;
  }
  LVar12 = 3;
  VVar11 = local_100;
LAB_0011a099:
  o->value_ = VVar11;
  o->tt_ = LVar12;
  return (size_t)(pbVar7 + (1 - (long)s));
}

Assistant:

size_t luaO_str2num (const char *s, TValue *o) {
  lua_Integer i; lua_Number n;
  const char *e;
  if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
    setivalue(o, i);
  }
  else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
    setfltvalue(o, n);
  }
  else
    return 0;  /* conversion failed */
  return (e - s) + 1;  /* success; return string size */
}